

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

int __thiscall hmac_hash::SHA1::init(SHA1 *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  SHA1 *this_local;
  
  this->m_h[0] = 0x67452301;
  this->m_h[1] = 0xefcdab89;
  this->m_h[2] = 0x98badcfe;
  this->m_h[3] = 0x10325476;
  this->m_h[4] = 0xc3d2e1f0;
  this->m_transforms = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_buffer);
  return extraout_EAX;
}

Assistant:

void SHA1::init() {
        // SHA1 initialization constants
        m_h[0] = 0x67452301;
        m_h[1] = 0xefcdab89;
        m_h[2] = 0x98badcfe;
        m_h[3] = 0x10325476;
        m_h[4] = 0xc3d2e1f0;
     
        // Reset counters
        m_transforms = 0;
        m_buffer.clear();
    }